

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O2

int __thiscall miniros::network::HttpFrame::incrementalParse(HttpFrame *this)

{
  int *piVar1;
  char cVar2;
  ulong uVar3;
  ParserState PVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  Token *pTVar11;
  int *piVar12;
  pointer pcVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  pointer __nptr;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long local_90;
  Token *local_88;
  pointer local_80;
  int *local_78;
  Field field;
  
  local_80 = (this->data)._M_dataplus._M_p;
  pcVar10 = local_80 + (this->data)._M_string_length;
  pcVar13 = local_80 + this->m_currentPosition;
  local_88 = &this->requestType;
  piVar1 = &(this->requestType).end;
  local_78 = &(this->requestUrl).end;
  iVar7 = -(int)local_80;
  PVar4 = this->m_state;
  __nptr = local_80 + this->m_tokenStart;
LAB_0022a280:
  iVar5 = (int)pcVar13;
  lVar15 = 0;
  do {
    pcVar6 = pcVar13 + lVar15;
    iVar8 = (int)local_80;
    iVar16 = (int)__nptr;
    if (pcVar10 <= pcVar6) {
LAB_0022a52f:
      this->m_tokenStart = iVar16 - iVar8;
      if (PVar4 != ParseBody) goto LAB_0022a58f;
LAB_0022a554:
      if ((long)this->m_contentLength < 0) {
        this->m_state = ParseComplete;
        uVar9 = (ulong)this->m_bodyPosition;
      }
      else {
        uVar9 = (long)this->m_bodyPosition + (long)this->m_contentLength;
        uVar3 = (this->data)._M_string_length;
        if (uVar3 < uVar9) {
          pcVar6 = local_80 + uVar3;
          goto LAB_0022a58f;
        }
        this->m_state = ParseComplete;
      }
      this->m_bodyEnd = (int)uVar9;
      pcVar6 = local_80 + uVar9;
LAB_0022a58f:
      iVar8 = (int)pcVar6 - iVar8;
      iVar7 = this->m_currentPosition;
      this->m_currentPosition = iVar8;
      return iVar8 - iVar7;
    }
    if (PVar4 == ParseFieldValue) {
      if ((*pcVar6 == '\r') && (pcVar13[lVar15 + 1] == '\n')) {
        local_90 = (long)(this->m_fieldName).start;
        pcVar6 = local_80 + local_90;
        iVar5 = strncasecmp(pcVar6,"Content-length",0xe);
        if (iVar5 == 0) {
          iVar5 = atoi(__nptr);
          this->m_contentLength = iVar5;
        }
        else {
          iVar5 = strncasecmp(pcVar6,"Connection",10);
          if (iVar5 == 0) {
            iVar5 = strncasecmp(__nptr,"keep-alive",10);
            if (iVar5 == 0) {
              this->m_keepAlive = true;
            }
            else {
              iVar5 = strncasecmp(__nptr,"close",5);
              if (iVar5 == 0) {
                this->m_keepAlive = false;
              }
            }
          }
          else {
            field.name._M_dataplus._M_p = (pointer)&field.name.field_2;
            field.name._M_string_length = 0;
            field.name.field_2._M_local_buf[0] = '\0';
            field.value._M_dataplus._M_p = (pointer)&field.value.field_2;
            field.value._M_string_length = 0;
            field.value.field_2._M_local_buf[0] = '\0';
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,pcVar6,pcVar6 + ((this->m_fieldName).end - local_90));
            std::__cxx11::string::operator=((string *)&field,(string *)local_b0);
            std::__cxx11::string::~string((string *)local_b0);
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,__nptr,pcVar13 + lVar15);
            std::__cxx11::string::operator=((string *)&field.value,(string *)local_b0);
            std::__cxx11::string::~string((string *)local_b0);
            std::
            vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
            ::emplace_back<miniros::network::HttpFrame::Field>(&this->fields,&field);
            Field::~Field(&field);
          }
        }
        pcVar13 = pcVar13 + lVar15 + 2;
        this->m_state = ParseFieldName;
        PVar4 = ParseFieldName;
        __nptr = pcVar13;
        goto LAB_0022a280;
      }
    }
    else {
      iVar14 = (int)lVar15;
      if (PVar4 == ParseFieldName) {
        cVar2 = *pcVar6;
        if ((cVar2 == '\n') || (cVar2 == '\r')) {
          if (pcVar13[lVar15 + 1] == '\n') {
            this->m_state = ParseBody;
            iVar7 = (iVar5 - iVar8) + iVar14 + 2;
            this->m_bodyPosition = iVar7;
            this->m_tokenStart = iVar7;
            goto LAB_0022a554;
          }
        }
        else if (cVar2 == ':') break;
      }
      else {
        if (PVar4 != ParseRequest) goto LAB_0022a52f;
        cVar2 = *pcVar6;
        if ((cVar2 == '\r') && (pcVar13[lVar15 + 1] == '\n')) {
          (this->requestHttpVersion).start = iVar16 - iVar8;
          (this->requestHttpVersion).end = iVar7 + iVar5 + iVar14;
          pcVar13 = pcVar13 + lVar15 + 2;
          this->m_state = ParseFieldName;
          PVar4 = ParseFieldName;
          __nptr = pcVar13;
          goto LAB_0022a280;
        }
        if (((local_88->start == *piVar1) && (pTVar11 = local_88, piVar12 = piVar1, cVar2 == ' '))
           || (((this->requestUrl).start == *local_78 &&
               (pTVar11 = &this->requestUrl, piVar12 = local_78, cVar2 == ' ')))) {
          pTVar11->start = iVar16 - iVar8;
          *piVar12 = iVar7 + iVar5 + iVar14;
          __nptr = pcVar13 + lVar15 + 1;
        }
      }
    }
    lVar15 = lVar15 + 1;
  } while( true );
  this->m_state = ParseFieldValue;
  (this->m_fieldName).start = iVar16 - iVar8;
  (this->m_fieldName).end = iVar7 + iVar5 + iVar14;
  pcVar13 = pcVar13 + lVar15 + 1;
  PVar4 = ParseFieldValue;
  __nptr = pcVar13;
  goto LAB_0022a280;
}

Assistant:

int HttpFrame::incrementalParse()
{
  const char *start = data.c_str();
  const char *end = start + data.length();
  const char* cp = start + m_currentPosition;

  const char* tokenStart = start + m_tokenStart;

  for (; cp < end;) {
    if (m_state == HttpFrame::ParseRequest) {
      if (strncmp(cp, "\r\n", 2) == 0) {
        requestHttpVersion.assign(tokenStart - start, cp - start);
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      } if (requestType.empty() && *cp == ' ') {
        requestType.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else if (requestUrl.empty() && *cp == ' ') {
        requestUrl.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else {
        // Error?
      }
    }
    else if (m_state == HttpFrame::ParseFieldName) {
      if (*cp == ':') {
        m_state = HttpFrame::ParseFieldValue;
        m_fieldName.assign(tokenStart - start, cp - start);
        cp++;
        tokenStart = cp;
        continue;
      }

      if (strncmp(cp, "\n\n", 2) == 0 || strncmp(cp, "\r\n", 2) == 0) {
        m_state = HttpFrame::ParseBody;
        cp += 2;
        tokenStart = cp;
        m_bodyPosition = cp - start;
        break;
      }
    } else if (m_state == HttpFrame::ParseFieldValue) {
      assert(tokenStart != nullptr);
      if (strncmp(cp, "\r\n", 2) == 0) {
        const char* namePtr = start + m_fieldName.start;
        if (strncasecmp(namePtr, "Content-length", 14) == 0)  {
          m_contentLength = atoi(tokenStart);
        } else if (strncasecmp(namePtr, "Connection", 10) == 0) {
          if (strncasecmp(tokenStart, "keep-alive", 10) == 0) {
            m_keepAlive = true;
          } else if (strncasecmp(tokenStart, "close", 5) == 0) {
            m_keepAlive = false;
          }
        } else {
          Field field;
          field.name = std::string(namePtr, m_fieldName.size());
          field.value = std::string(tokenStart, cp - tokenStart);
          fields.push_back(std::move(field));
        }
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      }
    } else // Any other state.
      break;
    cp++;
  }
  m_tokenStart = tokenStart - start;

  if (m_state == HttpFrame::ParseBody) {
    if (m_contentLength >= 0) {
      // Need body and got all the data.
      if (m_bodyPosition + m_contentLength <= data.length()) {
        m_state = HttpFrame::ParseComplete;
        m_bodyEnd = m_bodyPosition + m_contentLength;
        cp = start + m_bodyEnd;
      } else {
        // `data` does not contain full body yet, but need to advance `cp`.
        cp = start + data.length();
      }
    } else {
      m_state = HttpFrame::ParseComplete;
      m_bodyEnd = m_bodyPosition;
      cp = start + m_bodyEnd;
    }
  }

  int position = cp - start;
  int bytesParsed = position - m_currentPosition;
  m_currentPosition = position;

  return bytesParsed;
}